

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.cpp
# Opt level: O0

bool __thiscall VMStack::destroyTopFrame(VMStack *this)

{
  Frame *this_00;
  size_type sVar1;
  reference ppFVar2;
  Frame *frame;
  VMStack *this_local;
  
  sVar1 = std::stack<Frame_*,_std::deque<Frame_*,_std::allocator<Frame_*>_>_>::size
                    (&this->_frameStack);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    ppFVar2 = std::stack<Frame_*,_std::deque<Frame_*,_std::allocator<Frame_*>_>_>::top
                        (&this->_frameStack);
    this_00 = *ppFVar2;
    std::stack<Frame_*,_std::deque<Frame_*,_std::allocator<Frame_*>_>_>::pop(&this->_frameStack);
    if (this_00 != (Frame *)0x0) {
      Frame::~Frame(this_00);
      operator_delete(this_00);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool VMStack::destroyTopFrame() {
    if (_frameStack.size() == 0) {
        return false;
    }
    
    Frame *frame = _frameStack.top();
    _frameStack.pop();
    delete frame;
    
    return true;
}